

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_tet_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  REF_INT RVar10;
  int iVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  undefined8 uStack_c0;
  REF_INT cell;
  REF_INT local [27];
  
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 != 0) {
    uVar14 = (ulong)uVar4;
    pcVar13 = "create";
    uStack_c0 = 0x61;
    goto LAB_0011666c;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(3 / (long)iVar6);
  iVar11 = iVar5 * iVar6;
  if (3 < iVar11) {
    iVar9 = ((((iVar6 + 3) / iVar6) * (iVar11 + -4)) / iVar5 - iVar11) + 4;
  }
  if (iVar7 == iVar9) {
LAB_001161c8:
    uVar4 = ref_node_add(ref_node,0,local);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "add node";
      uStack_c0 = 0x72;
      goto LAB_0011666c;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[0];
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar12 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,1,local + 1);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "add node";
      uStack_c0 = 0x73;
      goto LAB_0011666c;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[1];
    pRVar2[lVar12 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar12 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,2,local + 2);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "add node";
      uStack_c0 = 0x74;
      goto LAB_0011666c;
    }
    pRVar2 = ref_node->real;
    lVar12 = (long)local[2];
    pRVar2[lVar12 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar12 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_node_add(ref_node,3,local + 3);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "add node";
      uStack_c0 = 0x75;
      goto LAB_0011666c;
    }
    pRVar3 = ref_node->real;
    lVar12 = (long)local[3];
    pRVar2 = pRVar3 + lVar12 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    pRVar3[lVar12 * 0xf + 2] = 1.0;
    lVar8 = -1;
    if (((-1 < lVar12) && (local[3] < ref_node->max)) && (-1 < ref_node->global[lVar12])) {
      lVar8 = ref_node->global[lVar12];
    }
    iVar6 = ref_mpi->n;
    iVar7 = (iVar6 + 3) / iVar6;
    if (lVar8 / (long)iVar7 < (long)(ulong)((int)(3 % (long)iVar6) + 1)) {
      lVar8 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      RVar10 = (REF_INT)(lVar8 / (long)iVar7);
    }
    else {
      lVar8 = -1;
      if ((-1 < local[3]) && (local[3] < ref_node->max)) {
        lVar8 = -1;
        if (-1 < ref_node->global[lVar12]) {
          lVar8 = ref_node->global[lVar12];
        }
      }
      iVar5 = (int)(3 / (long)iVar6);
      iVar6 = 4 - iVar6 * iVar5;
      RVar10 = iVar6 + (int)((lVar8 - iVar7 * iVar6) / (long)iVar5);
    }
    ref_node->part[lVar12] = RVar10;
    uVar4 = ref_cell_add(pRVar1->cell[8],local,&cell);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "add tet";
      uStack_c0 = 0x77;
      goto LAB_0011666c;
    }
  }
  else {
    iVar6 = (iVar6 + 3) / iVar6;
    iVar9 = 0;
    if (iVar6 + 1U < 3) {
      iVar9 = iVar6;
    }
    iVar11 = 4 - iVar11;
    if (iVar11 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar9) goto LAB_001161c8;
    iVar9 = (int)(2 / (long)iVar6);
    if (iVar11 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar9) goto LAB_001161c8;
    iVar9 = (int)(3 / (long)iVar6);
    if (iVar11 <= iVar9) {
      iVar9 = (3 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar9) goto LAB_001161c8;
  }
  uVar4 = ref_node_initialize_n_global(ref_node,4);
  if (uVar4 != 0) {
    uVar14 = (ulong)uVar4;
    pcVar13 = "init glob";
    uStack_c0 = 0x7a;
    goto LAB_0011666c;
  }
  iVar6 = ref_mpi->n;
  iVar7 = ref_mpi->id;
  iVar9 = 0;
  iVar5 = (int)(3 / (long)iVar6);
  iVar11 = iVar5 * iVar6;
  if (3 < iVar11) {
    iVar9 = ((((iVar6 + 3) / iVar6) * (iVar11 + -4)) / iVar5 - iVar11) + 4;
  }
  if (iVar7 == iVar9) {
LAB_00116724:
    uVar4 = ref_node_local(ref_node,0,local);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "loc";
      uStack_c0 = 0x86;
      goto LAB_0011666c;
    }
    uVar4 = ref_node_local(ref_node,1,local + 1);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "loc";
      uStack_c0 = 0x87;
      goto LAB_0011666c;
    }
    uVar4 = ref_node_local(ref_node,2,local + 2);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "loc";
      uStack_c0 = 0x88;
      goto LAB_0011666c;
    }
    local[3] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[3],local,&cell);
    if (uVar4 != 0) {
      uVar14 = (ulong)uVar4;
      pcVar13 = "add tri";
      uStack_c0 = 0x8a;
      goto LAB_0011666c;
    }
    iVar9 = ref_mpi->n;
    iVar7 = ref_mpi->id;
    iVar6 = (iVar9 + 3) / iVar9;
    uVar4 = iVar6 + 1;
    iVar5 = (int)(3 / (long)iVar9);
    iVar11 = 4 - iVar5 * iVar9;
  }
  else {
    iVar6 = (iVar6 + 3) / iVar6;
    uVar4 = iVar6 + 1;
    iVar9 = 0;
    if (uVar4 < 3) {
      iVar9 = iVar6;
    }
    iVar11 = 4 - iVar11;
    if (iVar11 <= iVar9) {
      iVar9 = (1 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar9) goto LAB_00116724;
    iVar9 = (int)(2 / (long)iVar6);
    if (iVar11 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 == iVar9) goto LAB_00116724;
  }
  iVar9 = 0;
  if (uVar4 < 3) {
    iVar9 = iVar6;
  }
  if (iVar11 <= iVar9) {
    iVar9 = (1 - iVar11 * iVar6) / iVar5 + iVar11;
  }
  if (iVar7 != iVar9) {
    iVar9 = (int)(2 / (long)iVar6);
    if (iVar11 <= iVar9) {
      iVar9 = (2 - iVar6 * iVar11) / iVar5 + iVar11;
    }
    if (iVar7 != iVar9) {
      return 0;
    }
  }
  uVar4 = ref_node_local(ref_node,1,local);
  if (uVar4 == 0) {
    uVar4 = ref_node_local(ref_node,2,local + 1);
    if (uVar4 == 0) {
      local[3] = 0x14;
      uVar4 = ref_cell_add(pRVar1->cell[0],local,&cell);
      if (uVar4 == 0) {
        return 0;
      }
      uVar14 = (ulong)uVar4;
      pcVar13 = "add edg";
      uStack_c0 = 0x97;
    }
    else {
      uVar14 = (ulong)uVar4;
      pcVar13 = "loc";
      uStack_c0 = 0x95;
    }
  }
  else {
    uVar14 = (ulong)uVar4;
    pcVar13 = "loc";
    uStack_c0 = 0x94;
  }
LAB_0011666c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
         uStack_c0,"ref_fixture_tet_grid",uVar14,pcVar13);
  return (REF_STATUS)uVar14;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tet_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 4;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 3;

  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[3])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    add_that_node(3, 0.0, 0.0, 1.0);

    RSS(ref_cell_add(ref_grid_tet(ref_grid), local, &cell), "add tet");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    RSS(ref_node_local(ref_node, global[2], &(local[2])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  global[0] = 1;
  global[1] = 2;
  global[3] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}